

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O0

SstStatusValue SstFFSPerformGets(SstStream Stream)

{
  SstStatusValue SVar1;
  SstStream in_RDI;
  SstStatusValue Ret;
  SstStream unaff_retaddr;
  FFSReaderMarshalBase *Info;
  FFSArrayRequest_conflict in_stack_00000098;
  SstStream in_stack_000000a0;
  FFSArrayRequest_conflict in_stack_00000118;
  SstStream in_stack_00000120;
  
  IssueReadRequests(in_stack_00000120,in_stack_00000118);
  SVar1 = WaitForReadRequests(in_RDI);
  if (SVar1 == SstSuccess) {
    if (in_RDI->ConfigParams->ReaderShortCircuitReads == 0) {
      FillReadRequests(in_stack_000000a0,in_stack_00000098);
    }
  }
  else {
    CP_verbose(in_RDI,CriticalVerbose,
               "Some memory read failed, not filling requests and returning failure\n");
  }
  ClearReadRequests(unaff_retaddr);
  return SVar1;
}

Assistant:

extern SstStatusValue SstFFSPerformGets(SstStream Stream)
{
    struct FFSReaderMarshalBase *Info = Stream->ReaderMarshalData;
    SstStatusValue Ret;

    IssueReadRequests(Stream, Info->PendingVarRequests);

    Ret = WaitForReadRequests(Stream);

    if (Ret == SstSuccess)
    {
        if (!Stream->ConfigParams->ReaderShortCircuitReads)
            FillReadRequests(Stream, Info->PendingVarRequests);
    }
    else
    {
        CP_verbose(Stream, CriticalVerbose,
                   "Some memory read failed, not filling requests and "
                   "returning failure\n");
    }
    ClearReadRequests(Stream);

    return Ret;
}